

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::ForceMatrixDecomposition::getAtomToGroupVectorColumn
          (Vector3d *__return_storage_ptr__,ForceMatrixDecomposition *this,int atom2,int cg2)

{
  Snapshot *pSVar1;
  Vector<double,_3U> VStack_38;
  
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>);
  pSVar1 = (this->super_ForceDecomposition).snap_;
  operator-(&VStack_38,
            &(pSVar1->cgData).position.
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start[cg2].super_Vector<double,_3U>,
            &(pSVar1->atomData).position.
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start[atom2].super_Vector<double,_3U>);
  Vector3<double>::operator=(__return_storage_ptr__,&VStack_38);
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
    Snapshot::wrapVector((this->super_ForceDecomposition).snap_,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d ForceMatrixDecomposition::getAtomToGroupVectorColumn(int atom2,
                                                                int cg2) {
    Vector3d d;

#ifdef IS_MPI
    d = cgColData.position[cg2] - atomColData.position[atom2];
#else
    d = snap_->cgData.position[cg2] - snap_->atomData.position[atom2];
#endif
    if (usePeriodicBoundaryConditions_) { snap_->wrapVector(d); }
    return d;
  }